

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O2

size_t __thiscall
level_mesh::assign_contact_groups
          (level_mesh *this,b_submesh_vec *submeshes,b_collision_vec *contacts,
          b_submesh_vec *orphans)

{
  pair<b_submesh_*,_b_submesh_*> *ppVar1;
  __normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
  _Var2;
  pointer ppbVar3;
  size_t sVar4;
  pointer ppbVar5;
  uint uVar6;
  b_submesh *sm;
  b_submesh_vec adjacents;
  b_submesh *sm1;
  b_collision contact;
  b_submesh *local_98;
  pointer local_90;
  pointer local_88;
  b_collision_vec *local_80;
  _Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_> local_78;
  b_submesh_vec *local_58;
  b_submesh *local_50;
  _Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
  local_48;
  
  local_80 = contacts;
  local_58 = orphans;
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<b_submesh*,b_submesh*>*,std::vector<std::pair<b_submesh*,b_submesh*>,std::allocator<std::pair<b_submesh*,b_submesh*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((contacts->
             super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (contacts->
             super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::reserve
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)&local_78,0x80);
  ppbVar5 = (submeshes->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppbVar3 = (submeshes->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar6 = 0;
  local_90 = ppbVar3;
  while( true ) {
    if (ppbVar5 == ppbVar3) {
      local_48._M_impl.super__Vector_impl_data._M_start =
           (local_80->
           super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_48._M_impl.super__Vector_impl_data._M_finish =
           (local_80->
           super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
           (local_80->
           super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      (local_80->
      super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_80->
      super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_80->
      super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
      ::~_Vector_base(&local_48);
      std::_Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>::~_Vector_base(&local_78);
      return (ulong)uVar6;
    }
    local_98 = *ppbVar5;
    if (local_98 == (b_submesh *)0x0) break;
    if (local_98->group == 0xffffffff) {
      local_98->group = uVar6;
      sVar4 = (local_98->super_b_model_instance).num_faces;
      local_88 = ppbVar5;
      while( true ) {
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ppVar1 = (local_80->
                 super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)local_98;
        for (_Var2 = std::
                     __lower_bound<__gnu_cxx::__normal_iterator<std::pair<b_submesh*,b_submesh*>*,std::vector<std::pair<b_submesh*,b_submesh*>,std::allocator<std::pair<b_submesh*,b_submesh*>>>>,std::pair<b_submesh*,b_submesh*>,__gnu_cxx::__ops::_Iter_less_val>
                               ((local_80->
                                super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,ppVar1,&local_48);
            (ppbVar5 = local_88, _Var2._M_current != ppVar1 &&
            (local_98 == (_Var2._M_current)->first)); _Var2._M_current = _Var2._M_current + 1) {
          local_50 = (_Var2._M_current)->second;
          if (local_50->group == 0xffffffff) {
            local_50->group = uVar6;
            std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::push_back
                      ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)&local_78,&local_50);
          }
        }
        if (local_78._M_impl.super__Vector_impl_data._M_start ==
            local_78._M_impl.super__Vector_impl_data._M_finish) break;
        local_98 = local_78._M_impl.super__Vector_impl_data._M_finish[-1];
        local_78._M_impl.super__Vector_impl_data._M_finish =
             local_78._M_impl.super__Vector_impl_data._M_finish + -1;
        sVar4 = sVar4 + (local_98->super_b_model_instance).num_faces;
      }
      if (sVar4 < 2) {
        *local_88 = (b_submesh *)0x0;
        std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::push_back(local_58,&local_98);
        ppbVar3 = local_90;
      }
      else {
        uVar6 = uVar6 + 1;
        ppbVar3 = local_90;
      }
    }
    ppbVar5 = ppbVar5 + 1;
  }
  __assert_fail("sm",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                ,0x1c6,
                "size_t level_mesh::assign_contact_groups(b_submesh_vec &, b_collision_vec &, b_submesh_vec &)"
               );
}

Assistant:

size_t level_mesh::assign_contact_groups(b_submesh_vec& submeshes, b_collision_vec& contacts,
		b_submesh_vec& orphans)
{
	std::sort(contacts.begin(), contacts.end());
	b_submesh_vec adjacents;
	adjacents.reserve(128);
	uint32_t group = 0;
	for (b_submesh_vec_it it = submeshes.begin(), end = submeshes.end(); it != end; ++it) {
		b_submesh* sm = *it;
		xr_assert(sm);
		if (sm->group != BAD_IDX)
			continue;
		sm->group = group;
		size_t num_faces = sm->num_faces;
		for (;;) {
#if defined(_MSC_VER) && _MSC_VER >= 1600
			b_collision contact(sm, nullptr);
#else
			b_collision contact(sm, 0);
#endif
			for (b_collision_vec_it end1 = contacts.end(),
					it1 = std::lower_bound(contacts.begin(), end1, contact);
					it1 != end1 && sm == it1->first; ++it1) {
				b_submesh* sm1 = it1->second;
				if (sm1->group == BAD_IDX) {
					sm1->group = group;
					adjacents.push_back(sm1);
				}
			}
			if (adjacents.empty())
				break;
			sm = adjacents.back();
			adjacents.pop_back();
			num_faces += sm->num_faces;
		}
		if (num_faces > 1) {
			++group;
		} else {
			*it = 0;
			orphans.push_back(sm);
		}
	}
	b_collision_vec().swap(contacts);
	return size_t(group);
}